

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool Catch::list(IStreamingReporter *reporter,Config *config)

{
  pointer pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar4;
  undefined4 extraout_var_00;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *pvVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer pTVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  undefined4 extraout_var_03;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  char cVar11;
  key_type *__k;
  pointer pTVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_bool> pVar13;
  vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> descriptions;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> matchedTestCases;
  map<Catch::StringRef,_Catch::TagInfo,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  tagCounts;
  undefined1 local_118 [16];
  undefined1 local_108 [32];
  _Rb_tree_node_base local_e8;
  undefined1 local_c8 [8];
  _Rb_tree_node_base _Stack_c0;
  size_t local_a0;
  undefined8 uStack_98;
  pointer local_88;
  pointer local_80;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> local_78;
  _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
  local_60;
  
  cVar11 = (config->m_data).listTests;
  if ((bool)cVar11 == true) {
    iVar2 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar4 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar3 = (*(pSVar4->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar4);
    pvVar5 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x20))
                       ((long *)CONCAT44(extraout_var_00,iVar3),config);
    filterTests((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)local_118,
                pvVar5,(TestSpec *)CONCAT44(extraout_var,iVar2),&config->super_IConfig);
    (*reporter->_vptr_IStreamingReporter[0x15])
              (reporter,(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
                        local_118,config);
    if ((pointer)local_118._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_118._0_8_,local_108._0_8_ - local_118._0_8_);
    }
  }
  if ((config->m_data).listTags == true) {
    iVar2 = (*(config->super_IConfig)._vptr_IConfig[0xd])(config);
    pSVar4 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar3 = (*(pSVar4->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar4);
    pvVar5 = (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x20))
                       ((long *)CONCAT44(extraout_var_02,iVar3),config);
    filterTests(&local_78,pvVar5,(TestSpec *)CONCAT44(extraout_var_01,iVar2),&config->super_IConfig)
    ;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar6 = local_78.
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        pTVar12 = (pTVar6->m_info->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar1 = (pTVar6->m_info->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_80 = pTVar6;
        if (pTVar12 != pTVar1) {
          __k = &pTVar12->lowerCased;
          do {
            iVar7 = std::
                    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
                    ::find(&local_60,__k);
            if ((_Rb_tree_header *)iVar7._M_node == &local_60._M_impl.super__Rb_tree_header) {
              _Stack_c0._M_parent = (_Base_ptr)0x0;
              local_c8 = (undefined1  [8])0x0;
              _Stack_c0._0_8_ = (pointer)0x0;
              _Stack_c0._M_left = &_Stack_c0;
              local_a0 = 0;
              uStack_98 = 0;
              local_118._0_8_ = __k->m_start;
              local_118._8_8_ = __k->m_size;
              local_108._16_8_ = (_Rb_tree_node_base *)0x0;
              local_108._8_4_ = _S_red;
              local_e8._M_parent = (_Base_ptr)0x0;
              local_e8._M_left = (_Base_ptr)0x0;
              local_108._24_8_ = (_Base_ptr)(local_108 + 8);
              local_e8._0_8_ = (_Base_ptr)(local_108 + 8);
              _Stack_c0._M_right = _Stack_c0._M_left;
              pVar13 = std::
                       _Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,std::less<Catch::StringRef>,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                       ::_M_emplace_unique<std::pair<Catch::StringRef,Catch::TagInfo>>
                                 ((_Rb_tree<Catch::StringRef,std::pair<Catch::StringRef_const,Catch::TagInfo>,std::_Select1st<std::pair<Catch::StringRef_const,Catch::TagInfo>>,std::less<Catch::StringRef>,std::allocator<std::pair<Catch::StringRef_const,Catch::TagInfo>>>
                                   *)&local_60,(pair<Catch::StringRef,_Catch::TagInfo> *)local_118);
              iVar7._M_node = (_Base_ptr)pVar13.first._M_node;
              std::
              _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
              ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                           *)local_108);
              std::
              _Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
              ::~_Rb_tree((_Rb_tree<Catch::StringRef,_Catch::StringRef,_std::_Identity<Catch::StringRef>,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
                           *)local_c8);
            }
            local_118._0_8_ = __k[-1].m_start;
            local_118._8_8_ = __k[-1].m_size;
            *(long *)(iVar7._M_node + 3) = *(long *)(iVar7._M_node + 3) + 1;
            std::
            _Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
            ::_M_insert_unique<Catch::StringRef_const&>
                      ((_Rb_tree<Catch::StringRef,Catch::StringRef,std::_Identity<Catch::StringRef>,std::less<Catch::StringRef>,std::allocator<Catch::StringRef>>
                        *)&iVar7._M_node[1]._M_left,(StringRef *)local_118);
            pTVar12 = (pointer)(__k + 1);
            __k = __k + 2;
          } while (pTVar12 != pTVar1);
        }
        pTVar6 = local_80 + 1;
      } while (pTVar6 != local_88);
    }
    local_118._0_8_ = (pointer)0x0;
    local_118._8_8_ = (pointer)0x0;
    local_108._0_8_ = (pointer)0x0;
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::reserve
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
               local_60._M_impl.super__Rb_tree_header._M_node_count);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::emplace_back<Catch::TagInfo>
                  ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118,
                   (TagInfo *)&p_Var8[1]._M_left);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
    }
    (*reporter->_vptr_IStreamingReporter[0x16])(reporter,local_118,config);
    std::vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>::~vector
              ((vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *)local_118);
    std::
    _Rb_tree<Catch::StringRef,_std::pair<const_Catch::StringRef,_Catch::TagInfo>,_std::_Select1st<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>,_std::less<Catch::StringRef>,_std::allocator<std::pair<const_Catch::StringRef,_Catch::TagInfo>_>_>
    ::~_Rb_tree(&local_60);
    if (local_78.super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    cVar11 = '\x01';
  }
  if ((config->m_data).listReporters == true) {
    local_c8 = (undefined1  [8])0x0;
    _Stack_c0._0_8_ = (pointer)0x0;
    _Stack_c0._M_parent = (_Base_ptr)0x0;
    pSVar4 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar2 = (*(pSVar4->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar4);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_03,iVar2));
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::reserve
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8,*(size_type *)(lVar9 + 0x28));
    p_Var10 = *(_Rb_tree_node_base **)(lVar9 + 0x18);
    if (p_Var10 != (_Rb_tree_node_base *)(lVar9 + 8)) {
      do {
        local_118._0_8_ = (pointer)local_108;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        if (*(long **)(p_Var10 + 2) == (long *)0x0) {
          __assert_fail("m_ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.hpp"
                        ,0x4b8,
                        "T *Catch::Detail::unique_ptr<Catch::IReporterFactory>::operator->() const [T = Catch::IReporterFactory]"
                       );
        }
        (**(code **)(**(long **)(p_Var10 + 2) + 0x18))(local_108 + 0x10);
        std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::
        emplace_back<Catch::ReporterDescription>
                  ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>
                    *)local_c8,(ReporterDescription *)local_118);
        if ((_Rb_tree_node_base *)local_108._16_8_ != &local_e8) {
          operator_delete((void *)local_108._16_8_,(ulong)(local_e8._0_8_ + 1));
        }
        if ((pointer)local_118._0_8_ != (pointer)local_108) {
          operator_delete((void *)local_118._0_8_,(ulong)(local_108._0_8_ + 1));
        }
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      } while (p_Var10 != (_Rb_tree_node_base *)(lVar9 + 8));
    }
    (*reporter->_vptr_IStreamingReporter[0x14])(reporter,local_c8,config);
    std::vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_>::~vector
              ((vector<Catch::ReporterDescription,_std::allocator<Catch::ReporterDescription>_> *)
               local_c8);
    cVar11 = '\x01';
  }
  return (bool)cVar11;
}

Assistant:

bool list(IStreamingReporter &reporter, Config const &config) {
        bool listed = false;
        if (config.listTests()) {
            listed = true;
            listTests(reporter, config);
        }
        if (config.listTags()) {
            listed = true;
            listTags(reporter, config);
        }
        if (config.listReporters()) {
            listed = true;
            listReporters(reporter, config);
        }
        return listed;
    }